

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryLeakDetectorTest.cpp
# Opt level: O1

void __thiscall
TEST_MemoryLeakDetectorTest_OneLeakUsingOperatorNewWithFileLine_Test::testBody
          (TEST_MemoryLeakDetectorTest_OneLeakUsingOperatorNewWithFileLine_Test *this)

{
  MemoryLeakDetector *this_00;
  bool bVar1;
  TestMemoryAllocator *allocator;
  char *pcVar2;
  char *otherBuffer;
  UtestShell *pUVar3;
  TestTerminator *pTVar4;
  SimpleString SStack_38;
  SimpleString output;
  
  this_00 = (this->super_TEST_GROUP_CppUTestGroupMemoryLeakDetectorTest).detector;
  allocator = defaultNewAllocator();
  pcVar2 = MemoryLeakDetector::allocMemory(this_00,allocator,4,"file.cpp",0x4d2,false);
  MemoryLeakDetector::stopChecking
            ((this->super_TEST_GROUP_CppUTestGroupMemoryLeakDetectorTest).detector);
  otherBuffer = MemoryLeakDetector::report
                          ((this->super_TEST_GROUP_CppUTestGroupMemoryLeakDetectorTest).detector,
                           mem_leak_period_checking);
  SimpleString::SimpleString(&output,otherBuffer);
  pUVar3 = UtestShell::getCurrent();
  SimpleString::SimpleString(&SStack_38,"file.cpp");
  bVar1 = SimpleString::contains(&output,&SStack_38);
  pTVar4 = UtestShell::getCurrentTestTerminator();
  (*pUVar3->_vptr_UtestShell[8])
            (pUVar3,(ulong)bVar1,"CHECK","output.contains(\"file.cpp\")",0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/MemoryLeakDetectorTest.cpp"
             ,0x13f,pTVar4);
  SimpleString::~SimpleString(&SStack_38);
  pUVar3 = UtestShell::getCurrent();
  SimpleString::SimpleString(&SStack_38,"1234");
  bVar1 = SimpleString::contains(&output,&SStack_38);
  pTVar4 = UtestShell::getCurrentTestTerminator();
  (*pUVar3->_vptr_UtestShell[8])
            (pUVar3,(ulong)bVar1,"CHECK","output.contains(\"1234\")",0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/MemoryLeakDetectorTest.cpp"
             ,0x140,pTVar4);
  SimpleString::~SimpleString(&SStack_38);
  (*PlatformSpecificFree)(pcVar2);
  SimpleString::~SimpleString(&output);
  return;
}

Assistant:

TEST(MemoryLeakDetectorTest, OneLeakUsingOperatorNewWithFileLine)
{
    char* mem = detector->allocMemory(defaultNewAllocator(), 4, "file.cpp", 1234);
    detector->stopChecking();
    SimpleString output = detector->report(mem_leak_period_checking);
    CHECK(output.contains("file.cpp"));
    CHECK(output.contains("1234"));
    PlatformSpecificFree(mem);
}